

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void xmlCleanupInputCallbacks(void)

{
  int local_c;
  int i;
  
  if (xmlInputCallbackInitialized != 0) {
    for (local_c = xmlInputCallbackNr + -1; -1 < local_c; local_c = local_c + -1) {
      xmlInputCallbackTable[local_c].matchcallback = (xmlInputMatchCallback)0x0;
      xmlInputCallbackTable[local_c].opencallback = (xmlInputOpenCallback)0x0;
      xmlInputCallbackTable[local_c].readcallback = (xmlInputReadCallback)0x0;
      xmlInputCallbackTable[local_c].closecallback = (xmlInputCloseCallback)0x0;
    }
    xmlInputCallbackNr = 0;
    xmlInputCallbackInitialized = 0;
  }
  return;
}

Assistant:

void
xmlCleanupInputCallbacks(void)
{
    int i;

    if (!xmlInputCallbackInitialized)
        return;

    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallbackTable[i].matchcallback = NULL;
        xmlInputCallbackTable[i].opencallback = NULL;
        xmlInputCallbackTable[i].readcallback = NULL;
        xmlInputCallbackTable[i].closecallback = NULL;
    }

    xmlInputCallbackNr = 0;
    xmlInputCallbackInitialized = 0;
}